

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

void predict(svm_params *params,svm_example **ec_arr,float *scores,size_t n)

{
  v_array<float> v2;
  size_t sVar1;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  size_t i;
  svm_model *model;
  size_t in_stack_ffffffffffffffa8;
  svm_params *in_stack_ffffffffffffffb8;
  svm_example *in_stack_ffffffffffffffc0;
  ulong uVar3;
  size_t sVar4;
  
  sVar4 = *(size_t *)(in_RDI + 0x38);
  for (uVar3 = 0; uVar3 < in_RCX; uVar3 = uVar3 + 1) {
    svm_example::compute_kernels(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    sVar1 = v_array<float>::size(*(v_array<float> **)(in_RSI + uVar3 * 8));
    if (sVar1 == 0) {
      *(undefined4 *)(in_RDX + uVar3 * 4) = 0;
    }
    else {
      v_array<float>::begin(*(v_array<float> **)(in_RSI + uVar3 * 8));
      in_stack_ffffffffffffffb8 = *(svm_params **)(sVar4 + 0x30);
      in_stack_ffffffffffffffc0 = *(svm_example **)*(undefined1 (*) [16])(sVar4 + 0x38);
      v2.end_array = (float *)uVar3;
      v2._0_16_ = *(undefined1 (*) [16])(sVar4 + 0x38);
      v2.erase_count = sVar4;
      fVar2 = dense_dot(*(float **)(sVar4 + 0x28),v2,in_stack_ffffffffffffffa8);
      *(float *)(in_RDX + uVar3 * 4) = fVar2 / *(float *)(in_RDI + 0x50);
    }
  }
  return;
}

Assistant:

void predict(svm_params& params, svm_example** ec_arr, float* scores, size_t n)
{
  svm_model* model = params.model;
  for (size_t i = 0; i < n; i++)
  {
    ec_arr[i]->compute_kernels(params);
    // cout<<"size of krow = "<<ec_arr[i]->krow.size()<<endl;
    if (ec_arr[i]->krow.size() > 0)
      scores[i] = dense_dot(ec_arr[i]->krow.begin(), model->alpha, model->num_support) / params.lambda;
    else
      scores[i] = 0;
  }
}